

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O2

void __thiscall
QPlainTextEditSearchWidget::QPlainTextEditSearchWidget
          (QPlainTextEditSearchWidget *this,QPlainTextEdit *parent)

{
  void *pvVar1;
  ConnectionType type;
  QArrayDataPointer<char16_t> local_90;
  Object local_78 [8];
  Object local_70 [8];
  Object local_68 [8];
  Object local_60 [8];
  Object local_58 [8];
  Object local_50 [8];
  Object local_48 [8];
  Object local_40 [8];
  QArrayDataPointer<char16_t> local_38;
  
  QWidget::QWidget((QWidget *)this,parent,0);
  *(undefined ***)this = &PTR_metaObject_00158920;
  *(undefined ***)(this + 0x10) = &PTR__QPlainTextEditSearchWidget_00158ad0;
  pvVar1 = operator_new(0x90);
  *(void **)(this + 0x28) = pvVar1;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined4 *)(this + 0x50) = 1;
  *(undefined8 *)(this + 0x54) = 0xb4b400006464;
  *(undefined2 *)(this + 0x5c) = 0;
  QTimer::QTimer((QTimer *)(this + 0x60),(QObject *)0x0);
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  Ui_QPlainTextEditSearchWidget::setupUi
            (*(Ui_QPlainTextEditSearchWidget **)(this + 0x28),(QWidget *)this);
  *(QPlainTextEdit **)(this + 0x88) = parent;
  this[0x90] = (QPlainTextEditSearchWidget)0x0;
  QWidget::hide();
  local_90.d = (Data *)0x0;
  local_90.ptr = L"* {color: grey}";
  local_90.size = 0xf;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QWidget::setStyleSheet(*(QString **)(*(long *)(this + 0x28) + 0x18));
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QWidget::setEnabled(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x18),0));
  *(undefined8 *)(this + 0x30) = 0;
  local_90.d = (Data *)deactivate;
  local_90.ptr = (char16_t *)0x0;
  type = (ConnectionType)this;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_40,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x38),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  local_90.d = (Data *)searchLineEditTextChanged;
  local_90.ptr = (char16_t *)0x0;
  QObject::
  connect<void(QLineEdit::*)(QString_const&),void(QPlainTextEditSearchWidget::*)(QString_const&)>
            (local_48,*(offset_in_QLineEdit_to_subr *)(*(long *)(this + 0x28) + 8),
             (Object *)QLineEdit::textChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  local_90.d = (Data *)doSearchDown;
  local_90.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_50,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x48),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_90.d = (Data *)doSearchUp;
  local_90.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_58,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x28),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  local_90.d = (Data *)setReplaceMode;
  local_90.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)(bool)>
            (local_60,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x40),
             (Object *)QAbstractButton::toggled,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  local_90.d = (Data *)doReplace;
  local_90.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),bool(QPlainTextEditSearchWidget::*)(bool)>
            (local_68,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x80),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_90.d = (Data *)doReplaceAll;
  local_90.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QPlainTextEditSearchWidget::*)()>
            (local_70,*(offset_in_QAbstractButton_to_subr *)(*(long *)(this + 0x28) + 0x88),
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  local_90.d = (Data *)performSearch;
  local_90.ptr = (char16_t *)0x0;
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QPlainTextEditSearchWidget::*)()>
            (local_78,(offset_in_QTimer_to_subr)(this + 0x60),(Object *)QTimer::timeout,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::installEventFilter((QObject *)this);
  QObject::installEventFilter(*(QObject **)(*(long *)(this + 0x28) + 8));
  QObject::installEventFilter(*(QObject **)(*(long *)(this + 0x28) + 0x10));
  return;
}

Assistant:

QPlainTextEditSearchWidget::QPlainTextEditSearchWidget(QPlainTextEdit *parent)
    : QWidget(parent),
      ui(new Ui::QPlainTextEditSearchWidget),
      selectionColor(0, 180, 0, 100) {
    ui->setupUi(this);
    _textEdit = parent;
    _darkMode = false;
    hide();
    ui->searchCountLabel->setStyleSheet(QStringLiteral("* {color: grey}"));
    // hiding will leave a open space in the horizontal layout
    ui->searchCountLabel->setEnabled(false);
    _currentSearchResult = 0;
    _searchResultCount = 0;

    connect(ui->closeButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::deactivate);
    connect(ui->searchLineEdit, &QLineEdit::textChanged, this,
            &QPlainTextEditSearchWidget::searchLineEditTextChanged);
    connect(ui->searchDownButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doSearchDown);
    connect(ui->searchUpButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doSearchUp);
    connect(ui->replaceToggleButton, &QPushButton::toggled, this,
            &QPlainTextEditSearchWidget::setReplaceMode);
    connect(ui->replaceButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doReplace);
    connect(ui->replaceAllButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doReplaceAll);

    connect(&_debounceTimer, &QTimer::timeout,
            this, &QPlainTextEditSearchWidget::performSearch);

    installEventFilter(this);
    ui->searchLineEdit->installEventFilter(this);
    ui->replaceLineEdit->installEventFilter(this);

#ifdef Q_OS_MAC
    // set the spacing to 8 for OS X
    layout()->setSpacing(8);
    ui->buttonFrame->layout()->setSpacing(9);

    // set the margin to 0 for the top buttons for OS X
    QString buttonStyle = QStringLiteral("QPushButton {margin: 0}");
    ui->closeButton->setStyleSheet(buttonStyle);
    ui->searchDownButton->setStyleSheet(buttonStyle);
    ui->searchUpButton->setStyleSheet(buttonStyle);
    ui->replaceToggleButton->setStyleSheet(buttonStyle);
    ui->matchCaseSensitiveButton->setStyleSheet(buttonStyle);
#endif
}